

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O1

void re2::ParseRegexp(int iters,string *regexp)

{
  Regexp *this;
  pointer local_1b0;
  ostream local_1a8 [376];
  
  if (0 < iters) {
    do {
      local_1b0 = (regexp->_M_dataplus)._M_p;
      local_1a8._0_4_ = *(undefined4 *)&regexp->_M_string_length;
      this = Regexp::Parse((StringPiece *)&local_1b0,LikePerl,(RegexpStatus *)0x0);
      if (this == (Regexp *)0x0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x284,3);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Check failed: re",0x10);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      Regexp::Decref(this);
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

void ParseRegexp(int iters, const string& regexp) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    re->Decref();
  }
}